

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void av1_subtract_plane(MACROBLOCK *x,BLOCK_SIZE plane_bsize,int plane)

{
  uint8_t *pred8;
  long src_stride;
  BitDepthInfo bd_info_00;
  BitDepthInfo BVar1;
  int in_EDX;
  undefined1 in_SIL;
  long in_RDI;
  BitDepthInfo bd_info;
  MACROBLOCKD *xd;
  int bh;
  int bw;
  macroblockd_plane *pd;
  macroblock_plane *p;
  MACROBLOCKD *in_stack_ffffffffffffffa8;
  int16_t *in_stack_ffffffffffffffc0;
  undefined3 in_stack_fffffffffffffff4;
  undefined4 uVar2;
  
  uVar2 = CONCAT13(in_SIL,in_stack_fffffffffffffff4);
  pred8 = (uint8_t *)(in_RDI + (long)in_EDX * 0x88);
  src_stride = in_RDI + 0x1b0 + (long)in_EDX * 0xa30;
  bd_info_00 = (BitDepthInfo)(in_RDI + 0x1a0);
  BVar1 = get_bit_depth_info(in_stack_ffffffffffffffa8);
  av1_subtract_block(bd_info_00,BVar1.use_highbitdepth_buf,BVar1.bit_depth,in_stack_ffffffffffffffc0
                     ,(long)*(int *)(src_stride + 0x28),*(uint8_t **)(src_stride + 0x10),src_stride,
                     pred8,CONCAT44(uVar2,in_EDX));
  return;
}

Assistant:

void av1_subtract_plane(MACROBLOCK *x, BLOCK_SIZE plane_bsize, int plane) {
  struct macroblock_plane *const p = &x->plane[plane];
  const struct macroblockd_plane *const pd = &x->e_mbd.plane[plane];
  assert(plane_bsize < BLOCK_SIZES_ALL);
  const int bw = block_size_wide[plane_bsize];
  const int bh = block_size_high[plane_bsize];
  const MACROBLOCKD *xd = &x->e_mbd;
  const BitDepthInfo bd_info = get_bit_depth_info(xd);

  av1_subtract_block(bd_info, bh, bw, p->src_diff, bw, p->src.buf,
                     p->src.stride, pd->dst.buf, pd->dst.stride);
}